

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::anon_unknown_2::StencilWriteMaskSeparateTestCase::test
          (StencilWriteMaskSeparateTestCase *this)

{
  int iVar1;
  RenderTarget *pRVar2;
  int iVar3;
  uint mask;
  
  pRVar2 = Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar1 = pRVar2->m_stencilBits;
  if (0 < iVar1) {
    iVar3 = 0;
    do {
      mask = 1 << ((byte)iVar3 & 0x1f);
      glu::CallLogWrapper::glStencilMaskSeparate
                (&(this->super_ApiCase).super_CallLogWrapper,this->m_stencilTargetFace,mask);
      ApiCase::expectError(&this->super_ApiCase,0);
      (*this->m_verifier->_vptr_StateVerifier[2])
                (this->m_verifier,
                 (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 (ulong)this->m_testTargetName,(ulong)mask);
      ApiCase::expectError(&this->super_ApiCase,0);
      iVar3 = iVar3 + 1;
    } while (iVar1 != iVar3);
  }
  return;
}

Assistant:

void test (void)
	{
		const int stencilBits = m_context.getRenderTarget().getStencilBits();

		for (int stencilBit = 0; stencilBit < stencilBits; ++stencilBit)
		{
			const int mask = 1 << stencilBit;

			glStencilMaskSeparate(m_stencilTargetFace, mask);
			expectError(GL_NO_ERROR);

			m_verifier->verifyInteger(m_testCtx, m_testTargetName, mask);
			expectError(GL_NO_ERROR);
		}
	}